

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode_test.cc
# Opt level: O0

void __thiscall
JsonTest_EncodeNullEnum_Test::~JsonTest_EncodeNullEnum_Test(JsonTest_EncodeNullEnum_Test *this)

{
  JsonTest_EncodeNullEnum_Test *this_local;
  
  ~JsonTest_EncodeNullEnum_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(JsonTest, EncodeNullEnum) {
  upb::Arena a;

  upb_test_Box* foo = upb_test_Box_new(a.ptr());
  google_protobuf_Value_set_null_value(upb_test_Box_mutable_val(foo, a.ptr()),
                                       google_protobuf_NULL_VALUE);

  EXPECT_EQ(R"({"val":null})", JsonEncode(foo, 0));
  EXPECT_EQ(R"({"val":null})",
            JsonEncode(foo, upb_JsonEncode_FormatEnumsAsIntegers));
}